

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_generation_test.cpp
# Opt level: O0

void genNames(char *prefix,int index,string *textures_dir,string *material,string *image,
             string *image_file)

{
  ostream *poVar1;
  string local_608 [32];
  string local_5e8 [32];
  string local_5c8 [32];
  string local_5a8 [32];
  __cxx11 local_588 [32];
  __cxx11 local_568 [35];
  char local_545;
  int local_544;
  string local_540 [32];
  string local_520 [32];
  string local_500 [32];
  stringstream local_4e0 [8];
  stringstream s_file;
  ostream local_4d0 [392];
  stringstream local_348 [8];
  stringstream s_img;
  ostream local_338 [376];
  stringstream local_1c0 [8];
  stringstream s_mat;
  ostream local_1b0 [376];
  string *local_38;
  string *image_file_local;
  string *image_local;
  string *material_local;
  string *textures_dir_local;
  char *pcStack_10;
  int index_local;
  char *prefix_local;
  
  local_38 = image_file;
  image_file_local = image;
  image_local = material;
  material_local = textures_dir;
  textures_dir_local._4_4_ = index;
  pcStack_10 = prefix;
  std::__cxx11::stringstream::stringstream(local_1c0);
  std::__cxx11::stringstream::stringstream(local_348);
  std::__cxx11::stringstream::stringstream(local_4e0);
  std::__cxx11::string::string(local_500);
  std::__cxx11::stringstream::str((string *)local_1c0);
  std::__cxx11::string::~string(local_500);
  std::__cxx11::string::string(local_520);
  std::__cxx11::stringstream::str((string *)local_348);
  std::__cxx11::string::~string(local_520);
  std::__cxx11::string::string(local_540);
  std::__cxx11::stringstream::str((string *)local_4e0);
  std::__cxx11::string::~string(local_540);
  poVar1 = std::operator<<(local_1b0,pcStack_10);
  local_544 = (int)std::setw(6);
  poVar1 = std::operator<<(poVar1,(_Setw)local_544);
  local_545 = (char)std::setfill<char>('0');
  poVar1 = std::operator<<(poVar1,local_545);
  std::__cxx11::to_string(local_568,textures_dir_local._4_4_);
  std::operator<<(poVar1,(string *)local_568);
  std::__cxx11::string::~string((string *)local_568);
  poVar1 = std::operator<<(local_338,pcStack_10);
  std::__cxx11::to_string(local_588,textures_dir_local._4_4_);
  poVar1 = std::operator<<(poVar1,(string *)local_588);
  std::operator<<(poVar1,".jpg");
  std::__cxx11::string::~string((string *)local_588);
  poVar1 = std::operator<<(local_4d0,(string *)material_local);
  std::__cxx11::stringstream::str();
  std::operator<<(poVar1,local_5a8);
  std::__cxx11::string::~string(local_5a8);
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=((string *)image_local,local_5c8);
  std::__cxx11::string::~string(local_5c8);
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=((string *)image_file_local,local_5e8);
  std::__cxx11::string::~string(local_5e8);
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=((string *)local_38,local_608);
  std::__cxx11::string::~string(local_608);
  std::__cxx11::stringstream::~stringstream(local_4e0);
  std::__cxx11::stringstream::~stringstream(local_348);
  std::__cxx11::stringstream::~stringstream(local_1c0);
  return;
}

Assistant:

void genNames(const char* prefix,
    const int index,
    const std::string & textures_dir,
    std::string & material,
    std::string & image,
    std::string & image_file)
{
    std::stringstream s_mat, s_img, s_file;
    s_mat.str(std::string());
    s_img.str(std::string());
    s_file.str(std::string());
    s_mat << prefix << std::setw(6) << std::setfill('0') << std::to_string(index);
    s_img << prefix << std::to_string(index) << IMG_EXT;
    s_file << textures_dir << s_img.str();

    material = s_mat.str();
    image = s_img.str();
    image_file = s_file.str();
}